

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlRelaxNGPtrWrap(xmlRelaxNGPtr ctxt)

{
  PyObject *ret;
  xmlRelaxNGPtr ctxt_local;
  
  if (ctxt == (xmlRelaxNGPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    ctxt_local = (xmlRelaxNGPtr)&_Py_NoneStruct;
  }
  else {
    ctxt_local = (xmlRelaxNGPtr)PyCapsule_New(ctxt,"xmlRelaxNGPtr",0);
  }
  return (PyObject *)ctxt_local;
}

Assistant:

PyObject *
libxml_xmlRelaxNGPtrWrap(xmlRelaxNGPtr ctxt)
{
    PyObject *ret;

    if (ctxt == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret =
        PyCapsule_New((void *) ctxt,
                                     (char *) "xmlRelaxNGPtr", NULL);
    return (ret);
}